

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

mt19937 * libtorrent::aux::random_engine(void)

{
  int iVar1;
  long lVar2;
  
  if (random_engine()::dev == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::dev);
    if (iVar1 != 0) {
      ::std::random_device::random_device(&random_engine::dev);
      __cxa_atexit(::std::random_device::~random_device,&random_engine::dev,&__dso_handle);
      __cxa_guard_release(&random_engine()::dev);
    }
  }
  lVar2 = __tls_get_addr(&PTR_004fa780);
  if (*(char *)(lVar2 + 0x20) == '\0') {
    random_engine();
  }
  if (*(char *)(lVar2 + 0x13b0) == '\0') {
    random_engine();
  }
  return (mt19937 *)(lVar2 + 0x28);
}

Assistant:

std::mt19937& random_engine()
		{
#ifdef TORRENT_BUILD_SIMULATOR
			// make sure random numbers are deterministic. Seed with a fixed number
			static std::mt19937 rng(0x82daf973);
#else

#if TORRENT_BROKEN_RANDOM_DEVICE
			struct {
				std::uint32_t operator()() const
				{
					std::uint32_t ret;
					crypto_random_bytes({reinterpret_cast<char*>(&ret), sizeof(ret)});
					return ret;
				}
			} dev;
#else
			static std::random_device dev;
#endif
#ifdef BOOST_NO_CXX11_THREAD_LOCAL
			static std::seed_seq seed({dev(), dev(), dev(), dev()});
			static std::mt19937 rng(seed);
#else
			thread_local static std::seed_seq seed({dev(), dev(), dev(), dev()});
			thread_local static std::mt19937 rng(seed);
#endif
#endif
			return rng;
		}